

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.hpp
# Opt level: O2

void __thiscall
jsoncons::csv::
basic_csv_reader<char,jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,std::allocator<char>>
::
basic_csv_reader<jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>
          (basic_csv_reader<char,jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,std::allocator<char>>
           *this,iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *source,basic_json_visitor<char> *visitor,basic_csv_decode_options<char> *options,
          allocator<char> *alloc)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&),_jsoncons::csv::default_csv_parsing>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&),_jsoncons::csv::default_csv_parsing>
             ::_M_manager;
  basic_csv_reader<jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>
            (this,source,visitor,options,
             (function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *)&local_28,
             alloc);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

basic_csv_reader(Sourceable&& source,
                         basic_json_visitor<CharT>& visitor,
                         const basic_csv_decode_options<CharT>& options, 
                         const Allocator& alloc = Allocator())

            : basic_csv_reader(std::forward<Sourceable>(source), 
                               visitor, 
                               options, 
                               default_csv_parsing(),
                               alloc)
        {
        }